

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int uv_pipe_pending_count(uv_pipe_t *handle)

{
  int iVar1;
  
  iVar1 = 0;
  if ((handle->ipc != 0) && (handle->accepted_fd != -1)) {
    if (handle->queued_fds != (void *)0x0) {
      return *(int *)((long)handle->queued_fds + 4) + 1;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int uv_pipe_pending_count(uv_pipe_t* handle) {
  uv__stream_queued_fds_t* queued_fds;

  if (!handle->ipc)
    return 0;

  if (handle->accepted_fd == -1)
    return 0;

  if (handle->queued_fds == NULL)
    return 1;

  queued_fds = handle->queued_fds;
  return queued_fds->offset + 1;
}